

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmaze.c
# Opt level: O2

void save_waterlevel(memfile *mf)

{
  bubble *pbVar1;
  boolean bVar2;
  bubble **ppbVar3;
  uchar **ppuVar4;
  long lVar5;
  int value;
  
  bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level);
  if (bVar2 != '\0') {
    value = 0;
    mtag(mf,0,MTAG_WATERLEVEL);
    for (ppbVar3 = &bbubbles; *ppbVar3 != (bubble *)0x0; ppbVar3 = &(*ppbVar3)->next) {
      value = value + 1;
    }
    mwrite32(mf,value);
    mwrite32(mf,xmin);
    mwrite32(mf,ymin);
    mwrite32(mf,xmax);
    mwrite32(mf,ymax);
    mwrite8(mf,bubble_up);
    ppbVar3 = &bbubbles;
    while (pbVar1 = *ppbVar3, pbVar1 != (bubble *)0x0) {
      mwrite8(mf,pbVar1->x);
      mwrite8(mf,pbVar1->y);
      mwrite8(mf,pbVar1->dx);
      mwrite8(mf,pbVar1->dy);
      ppuVar4 = bmask;
      for (lVar5 = 0; lVar5 != 7; lVar5 = lVar5 + 1) {
        if (pbVar1->bm == *ppuVar4) {
          mwrite8(mf,(int8_t)lVar5);
        }
        ppuVar4 = ppuVar4 + 1;
      }
      ppbVar3 = &pbVar1->next;
    }
  }
  return;
}

Assistant:

void save_waterlevel(struct memfile *mf)
{
	struct bubble *b;
	int i, n;

	if (!Is_waterlevel(&u.uz)) return;

	/*
	 * We're assuming that the number of bubbles stays constant,
	 * as we can't reasonably tag it anyway.  If they don't, we
	 * just end up with a diff that's longer than it needs to be.
	 */
	mtag(mf, 0, MTAG_WATERLEVEL);
	n = 0;
	for (b = bbubbles; b; b = b->next)
	    ++n;
	mwrite32(mf, n);
	mwrite32(mf, xmin);
	mwrite32(mf, ymin);
	mwrite32(mf, xmax);
	mwrite32(mf, ymax);
	mwrite8(mf, bubble_up);
	for (b = bbubbles; b; b = b->next) {
	    mwrite8(mf, b->x);
	    mwrite8(mf, b->y);
	    mwrite8(mf, b->dx);
	    mwrite8(mf, b->dy);
	    for (i = 0; i < SIZE(bmask); i++)
		if (b->bm == bmask[i])
		    mwrite8(mf, i);
	}
}